

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

container_t * container_remove(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  uint16_t uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  array_container_t *run;
  int iVar7;
  uint uVar8;
  uint8_t typecode_local;
  
  typecode_local = typecode;
  run = (array_container_t *)get_writable_copy_if_shared(c,&typecode_local);
  if (typecode_local == '\x03') {
    uVar5 = interleavedBinarySearch((rle16_t *)run->array,run->cardinality,val);
    if ((int)uVar5 < 0) {
      if (uVar5 != 0xffffffff) {
        uVar6 = -uVar5 - 2;
        prVar3 = (rle16_t *)run->array;
        uVar8 = (uint)val - (uint)prVar3[uVar6].value;
        uVar2 = prVar3[uVar6].length;
        if ((int)uVar8 < (int)(uint)uVar2) {
          prVar3[uVar6].length = (ushort)uVar8 - 1;
          uVar5 = ~uVar5;
          makeRoomAtIndex((run_container_t *)run,(uint16_t)uVar5);
          prVar3 = (rle16_t *)run->array;
          prVar3[uVar5].value = val + 1;
          prVar3[uVar5].length = uVar2 + ~(ushort)uVar8;
        }
        else if (uVar8 == uVar2) {
          prVar3[uVar6].length = uVar2 - 1;
        }
      }
    }
    else {
      prVar3 = (rle16_t *)run->array;
      uVar1 = prVar3[uVar5].length;
      if (uVar1 == 0) {
        uVar5 = uVar5 & 0xffff;
        memmove(prVar3 + uVar5,prVar3 + (ulong)uVar5 + 1,(long)(int)(~uVar5 + run->cardinality) << 2
               );
        run->cardinality = run->cardinality + -1;
      }
      else {
        prVar3[uVar5].value = prVar3[uVar5].value + 1;
        prVar3[uVar5].length = uVar1 - 1;
      }
    }
    *new_typecode = '\x03';
  }
  else if (typecode_local == '\x02') {
    *new_typecode = '\x02';
    uVar5 = binarySearch((uint16_t *)run->array,run->cardinality,val);
    if (-1 < (int)uVar5) {
      memmove(&((rle16_t *)run->array)->value + uVar5,&((rle16_t *)run->array)->length + uVar5,
              (long)(int)(~uVar5 + run->cardinality) * 2);
      run->cardinality = run->cardinality + -1;
    }
  }
  else {
    uVar4 = *(ulong *)((rle16_t *)run->array + (ulong)(val >> 6) * 2);
    iVar7 = run->cardinality - (uint)((uVar4 >> ((ulong)val & 0x3f) & 1) != 0);
    run->cardinality = iVar7;
    *(ulong *)((rle16_t *)run->array + (ulong)(val >> 6) * 2) = uVar4 & ~(1L << ((ulong)val & 0x3f))
    ;
    if ((iVar7 < 0x1001 & (byte)(uVar4 >> ((byte)val & 0x3f))) == 1) {
      *new_typecode = '\x02';
      run = array_container_from_bitset((bitset_container_t *)run);
    }
    else {
      *new_typecode = '\x01';
    }
  }
  return run;
}

Assistant:

static inline container_t *container_remove(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode) {
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            if (bitset_container_remove(CAST_bitset(c), val)) {
                int card = bitset_container_cardinality(CAST_bitset(c));
                if (card <= DEFAULT_MAX_SIZE) {
                    *new_typecode = ARRAY_CONTAINER_TYPE;
                    return array_container_from_bitset(CAST_bitset(c));
                }
            }
            *new_typecode = typecode;
            return c;
        case ARRAY_CONTAINER_TYPE:
            *new_typecode = typecode;
            array_container_remove(CAST_array(c), val);
            return c;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_remove(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}